

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_serial_posix.c
# Opt level: O1

int platform_serial_get_modem_status(int fd)

{
  int status;
  uint local_c;
  
  local_c = 0;
  ioctl(fd,0x5415,&local_c);
  return (local_c >> 1 & 0x40 | local_c >> 3 & 0x20 | local_c >> 1 & 0x10) + (local_c & 0x40) * 2;
}

Assistant:

int platform_serial_get_modem_status(int fd) {
    int status = 0;
    int retstatus = 0;

    ioctl(fd, TIOCMGET, &status);

    if (status & TIOCM_CTS) {
        retstatus |= 0x0010;
    }

    if (status & TIOCM_DSR) {
        retstatus |= 0x0020;
    }

    if (status & TIOCM_RNG) {
        retstatus |= 0x0040;
    }

    if (status & TIOCM_CAR) {
        retstatus |= 0x0080;
    }

    return retstatus;
}